

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O3

void color_quantize(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  uint uVar2;
  _func_void_j_decompress_ptr *p_Var3;
  JSAMPROW pJVar4;
  JDIMENSION JVar5;
  ulong uVar6;
  JSAMPROW pJVar7;
  JSAMPLE JVar8;
  ulong uVar9;
  
  if (0 < num_rows) {
    p_Var3 = cinfo->cquantize[1].finish_pass;
    JVar1 = cinfo->output_width;
    uVar2 = cinfo->out_color_components;
    uVar6 = 0;
    do {
      if (JVar1 != 0) {
        pJVar7 = output_buf[uVar6];
        pJVar4 = input_buf[uVar6];
        JVar5 = JVar1;
        do {
          if ((int)uVar2 < 1) {
            JVar8 = '\0';
          }
          else {
            uVar9 = 0;
            JVar8 = '\0';
            do {
              JVar8 = JVar8 + *(char *)(*(long *)(p_Var3 + uVar9 * 8) + (ulong)pJVar4[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
            pJVar4 = pJVar4 + (ulong)(uVar2 - 1) + 1;
          }
          *pJVar7 = JVar8;
          pJVar7 = pJVar7 + 1;
          JVar5 = JVar5 - 1;
        } while (JVar5 != 0);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
color_quantize (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		JSAMPARRAY output_buf, int num_rows)
/* General case, no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  JSAMPARRAY colorindex = cquantize->colorindex;
  register int pixcode, ci;
  register JSAMPROW ptrin, ptrout;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  register int nc = cinfo->out_color_components;

  for (row = 0; row < num_rows; row++) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = width; col > 0; col--) {
      pixcode = 0;
      for (ci = 0; ci < nc; ci++) {
	pixcode += GETJSAMPLE(colorindex[ci][GETJSAMPLE(*ptrin++)]);
      }
      *ptrout++ = (JSAMPLE) pixcode;
    }
  }
}